

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.hpp
# Opt level: O3

void __thiscall duckdb::CSVReaderOptions::CSVReaderOptions(CSVReaderOptions *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_> __l_01;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_bool>_> __l_02;
  allocator_type local_25a;
  less<duckdb::LogicalTypeId> local_259;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  vector<duckdb::LogicalType,_true> *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  string *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  string *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  LogicalType local_1f8 [24];
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  LogicalType local_1a0 [24];
  undefined1 local_188 [48];
  LogicalType local_158 [24];
  LogicalType local_140 [8];
  Value local_138 [16];
  LogicalType local_128 [24];
  LogicalType local_110 [24];
  LogicalType local_f8 [24];
  LogicalType local_e0 [24];
  LogicalType local_c8 [24];
  allocator_type local_b0 [64];
  Value local_70 [64];
  
  DialectOptions::DialectOptions(&this->dialect_options);
  (this->ignore_errors).set_by_user = false;
  (this->ignore_errors).value = false;
  (this->store_rejects).set_by_user = false;
  (this->store_rejects).value = false;
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"reject_errors","");
  (this->rejects_table_name).set_by_user = false;
  pbVar1 = &(this->rejects_table_name).value;
  paVar2 = &(this->rejects_table_name).value.field_2;
  (this->rejects_table_name).value._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)pbVar1,local_1c0,local_1c0 + local_1b8);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  local_208 = paVar2;
  local_200 = pbVar1;
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"reject_scans","");
  (this->rejects_scan_name).set_by_user = false;
  pbVar1 = &(this->rejects_scan_name).value;
  paVar2 = &(this->rejects_scan_name).value.field_2;
  (this->rejects_scan_name).value._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)pbVar1,local_1e0,local_1e0 + local_1d8);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  this->rejects_limit = 0;
  this->buffer_sample_size = 0x19000;
  local_218 = paVar2;
  local_210 = pbVar1;
  local_188._0_8_ = local_188 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,anon_var_dwarf_d0a3e5 + 9);
  local_220 = &this->null_str;
  __l._M_len = 1;
  __l._M_array = (iterator)local_188;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_220->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,__l,local_b0);
  if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
    operator_delete((void *)local_188._0_8_);
  }
  this->compression = AUTO_DETECT;
  this->allow_quoted_nulls = true;
  this->comment = '\0';
  (this->sql_types_per_column)._M_h._M_buckets = &(this->sql_types_per_column)._M_h._M_single_bucket
  ;
  (this->sql_types_per_column)._M_h._M_bucket_count = 1;
  (this->sql_types_per_column)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sql_types_per_column)._M_h._M_element_count = 0;
  (this->sql_types_per_column)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sql_types_per_column)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sql_types_per_column)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sql_type_list).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->columns_set = false;
  duckdb::LogicalType::LogicalType((LogicalType *)local_188,VARCHAR);
  duckdb::LogicalType::LogicalType((LogicalType *)(local_188 + 0x18),DOUBLE);
  duckdb::LogicalType::LogicalType(local_158,BIGINT);
  duckdb::LogicalType::LogicalType(local_140,TIMESTAMP_TZ);
  duckdb::LogicalType::LogicalType(local_128,TIMESTAMP);
  duckdb::LogicalType::LogicalType(local_110,DATE);
  duckdb::LogicalType::LogicalType(local_f8,TIME);
  duckdb::LogicalType::LogicalType(local_e0,BOOLEAN);
  duckdb::LogicalType::LogicalType(local_c8,SQLNULL);
  __l_00._M_len = 9;
  __l_00._M_array = (iterator)local_188;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&(this->auto_type_candidates).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__l_00,
             (allocator_type *)local_b0);
  lVar4 = 0xc0;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_188 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_258 = &(this->sniffer_user_mismatch_error).field_2;
  (this->sniffer_user_mismatch_error)._M_dataplus._M_p = (pointer)local_258;
  (this->sniffer_user_mismatch_error)._M_string_length = 0;
  (this->sniffer_user_mismatch_error).field_2._M_local_buf[0] = '\0';
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->was_type_manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->maximum_line_size).set_by_user = false;
  (this->maximum_line_size).value = 2000000;
  this->normalize_names = false;
  (this->force_not_null_names)._M_h._M_buckets = &(this->force_not_null_names)._M_h._M_single_bucket
  ;
  (this->force_not_null_names)._M_h._M_bucket_count = 1;
  (this->force_not_null_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->force_not_null_names)._M_h._M_element_count = 0;
  (this->force_not_null_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->force_not_null_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->force_not_null_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->force_not_null_names)._M_h._M_single_bucket + 4) = 0;
  *(undefined8 *)
   ((long)&(this->force_not_null).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 4) = 0;
  this->sample_size_chunks = 10;
  this->all_varchar = false;
  this->auto_detect = true;
  local_228 = &(this->file_path).field_2;
  (this->file_path)._M_dataplus._M_p = (pointer)local_228;
  (this->file_path)._M_string_length = 0;
  (this->file_path).field_2._M_local_buf[0] = '\0';
  (this->buffer_size_option).set_by_user = false;
  (this->buffer_size_option).value = 32000000;
  local_230 = &this->decimal_separator;
  local_238 = &(this->decimal_separator).field_2;
  (this->decimal_separator)._M_dataplus._M_p = (pointer)local_238;
  local_250 = &this->auto_type_candidates;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,".","");
  this->null_padding = false;
  this->parallel = true;
  local_240 = &this->encoding;
  local_248 = &(this->encoding).field_2;
  (this->encoding)._M_dataplus._M_p = (pointer)local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"utf-8","");
  p_Var3 = &(this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_quote).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->user_defined_parameters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->force_quote).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->force_quote).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
  (this->prefix)._M_string_length = 0;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  (this->suffix)._M_dataplus._M_p = (pointer)&(this->suffix).field_2;
  (this->suffix)._M_string_length = 0;
  (this->suffix).field_2._M_local_buf[0] = '\0';
  (this->write_newline)._M_dataplus._M_p = (pointer)&(this->write_newline).field_2;
  (this->write_newline)._M_string_length = 0;
  (this->write_newline).field_2._M_local_buf[0] = '\0';
  duckdb::LogicalType::LogicalType(local_1f8,SQLNULL);
  duckdb::Value::Value((Value *)local_b0,local_1f8);
  local_188[0] = 0xf;
  duckdb::Value::Value((Value *)(local_188 + 8),(Value *)local_b0);
  duckdb::LogicalType::LogicalType(local_1a0,SQLNULL);
  duckdb::Value::Value(local_70,local_1a0);
  local_140[0] = (LogicalType)0x13;
  duckdb::Value::Value(local_138,local_70);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_188;
  std::
  map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  ::map(&this->write_date_format,__l_01,&local_259,&local_25a);
  lVar4 = 0x50;
  do {
    duckdb::Value::~Value((Value *)(local_188 + lVar4));
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  duckdb::Value::~Value(local_70);
  duckdb::LogicalType::~LogicalType(local_1a0);
  duckdb::Value::~Value((Value *)local_b0);
  duckdb::LogicalType::~LogicalType(local_1f8);
  local_188._0_4_ = 0x13000f;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_188;
  std::
  map<duckdb::LogicalTypeId,_bool,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
  ::map(&this->has_format,__l_02,(less<duckdb::LogicalTypeId> *)local_b0,(allocator_type *)local_70)
  ;
  this->multi_file_reader = false;
  return;
}

Assistant:

CSVReaderOptions() {
	}